

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pp.cpp
# Opt level: O1

int __thiscall glslang::TPpContext::CPPelse(TPpContext *this,int matchelse,TPpToken *ppToken)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int unaff_EBP;
  int iVar4;
  
  this->inElseSkip = true;
  iVar1 = scanToken(this,ppToken);
  iVar4 = 0;
  do {
    do {
      while (iVar1 != 0x23) {
        if (iVar1 == -1) goto LAB_00445ac3;
        while( true ) {
          if (iVar1 == -1) {
            return -1;
          }
          if (iVar1 == 10) break;
          iVar1 = scanToken(this,ppToken);
        }
        iVar1 = scanToken(this,ppToken);
      }
      iVar1 = scanToken(this,ppToken);
    } while (iVar1 != 0xa2);
    iVar2 = TStringAtomMap::getAtom(&this->atomStrings,ppToken->name);
    if (iVar2 - 0xa5U < 3) {
      iVar4 = iVar4 + 1;
      if ((this->ifdepth < 0x41) && (this->elsetracker < 0x41)) {
        this->ifdepth = this->ifdepth + 1;
        this->elsetracker = this->elsetracker + 1;
        iVar3 = 0;
      }
      else {
        (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                  (this->parseContext,ppToken,"maximum nesting depth exceeded","#if/#ifdef/#ifndef",
                   "");
        unaff_EBP = -1;
        iVar3 = 1;
      }
      iVar1 = 0xa2;
    }
    else if (iVar2 == 0xaa) {
      iVar1 = scanToken(this,ppToken);
      iVar1 = extraTokenCheck(this,0xaa,ppToken,iVar1);
      iVar2 = this->elsetracker;
      this->elseSeen[iVar2] = false;
      this->elsetracker = iVar2 + -1;
      if (iVar4 != 0) {
        iVar4 = iVar4 + -1;
        this->ifdepth = this->ifdepth + -1;
        goto LAB_00445ab4;
      }
      iVar3 = 3;
      iVar4 = 0;
      if (0 < this->ifdepth) {
        this->ifdepth = this->ifdepth + -1;
      }
    }
    else if (iVar4 == 0 && matchelse != 0) {
      iVar1 = 0xa2;
      iVar4 = 0;
      if (iVar2 == 0xa9) {
        if (this->elseSeen[this->elsetracker] == true) {
          (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                    (this->parseContext,ppToken,"#elif after #else","#elif","");
        }
        if (0 < this->ifdepth) {
          this->ifdepth = this->ifdepth + -1;
          iVar2 = this->elsetracker;
          this->elseSeen[iVar2] = false;
          this->elsetracker = iVar2 + -1;
        }
        this->inElseSkip = false;
        unaff_EBP = CPPif(this,ppToken);
        iVar3 = 1;
      }
      else {
        if (iVar2 != 0xa8) goto LAB_00445ab4;
        this->elseSeen[this->elsetracker] = true;
        iVar1 = scanToken(this,ppToken);
        iVar1 = extraTokenCheck(this,0xa8,ppToken,iVar1);
        iVar3 = 3;
      }
    }
    else {
      iVar3 = 0;
      iVar1 = 0xa2;
      if (iVar2 == 0xa9) {
        if (this->elseSeen[this->elsetracker] == true) {
          (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                    (this->parseContext,ppToken,"#elif after #else","#elif","");
          goto LAB_00445ab4;
        }
      }
      else if (iVar2 == 0xa8) {
        if (this->elseSeen[this->elsetracker] == true) {
          (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                    (this->parseContext,ppToken,"#else after #else","#else","");
        }
        else {
          this->elseSeen[this->elsetracker] = true;
        }
        iVar1 = scanToken(this,ppToken);
        iVar1 = extraTokenCheck(this,0xa8,ppToken,iVar1);
LAB_00445ab4:
        iVar3 = 0;
      }
    }
  } while (iVar3 == 0);
  if (iVar3 == 3) {
LAB_00445ac3:
    this->inElseSkip = false;
    unaff_EBP = iVar1;
  }
  return unaff_EBP;
}

Assistant:

int TPpContext::CPPelse(int matchelse, TPpToken* ppToken)
{
    inElseSkip = true;
    int depth = 0;
    int token = scanToken(ppToken);

    while (token != EndOfInput) {
        if (token != '#') {
            while (token != '\n' && token != EndOfInput)
                token = scanToken(ppToken);

            if (token == EndOfInput)
                return token;

            token = scanToken(ppToken);
            continue;
        }

        if ((token = scanToken(ppToken)) != PpAtomIdentifier)
            continue;

        int nextAtom = atomStrings.getAtom(ppToken->name);
        if (nextAtom == PpAtomIf || nextAtom == PpAtomIfdef || nextAtom == PpAtomIfndef) {
            depth++;
            if (ifdepth >= maxIfNesting || elsetracker >= maxIfNesting) {
                parseContext.ppError(ppToken->loc, "maximum nesting depth exceeded", "#if/#ifdef/#ifndef", "");
                return EndOfInput;
            } else {
                ifdepth++;
                elsetracker++;
            }
        } else if (nextAtom == PpAtomEndif) {
            token = extraTokenCheck(nextAtom, ppToken, scanToken(ppToken));
            elseSeen[elsetracker] = false;
            --elsetracker;
            if (depth == 0) {
                // found the #endif we are looking for
                if (ifdepth > 0)
                    --ifdepth;
                break;
            }
            --depth;
            --ifdepth;
        } else if (matchelse && depth == 0) {
            if (nextAtom == PpAtomElse) {
                elseSeen[elsetracker] = true;
                token = extraTokenCheck(nextAtom, ppToken, scanToken(ppToken));
                // found the #else we are looking for
                break;
            } else if (nextAtom == PpAtomElif) {
                if (elseSeen[elsetracker])
                    parseContext.ppError(ppToken->loc, "#elif after #else", "#elif", "");
                /* we decrement ifdepth here, because CPPif will increment
                * it and we really want to leave it alone */
                if (ifdepth > 0) {
                    --ifdepth;
                    elseSeen[elsetracker] = false;
                    --elsetracker;
                }
                inElseSkip = false;
                return CPPif(ppToken);
            }
        } else if (nextAtom == PpAtomElse) {
            if (elseSeen[elsetracker])
                parseContext.ppError(ppToken->loc, "#else after #else", "#else", "");
            else
                elseSeen[elsetracker] = true;
            token = extraTokenCheck(nextAtom, ppToken, scanToken(ppToken));
        } else if (nextAtom == PpAtomElif) {
            if (elseSeen[elsetracker])
                parseContext.ppError(ppToken->loc, "#elif after #else", "#elif", "");
        }
    }
    
    inElseSkip = false;
    return token;
}